

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O0

Boolean RTCResult(int Iter,double rNorm,double bNorm,IterIdType IterId)

{
  LASErrIdType LVar1;
  Boolean local_28;
  Boolean Result;
  IterIdType IterId_local;
  double bNorm_local;
  double rNorm_local;
  int Iter_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((rNorm < RTCEps * bNorm) ||
       ((ABS(bNorm) < 2.2250738585072014e-307 && (ABS((rNorm + 1.0) - 1.0) < 2.220446049250313e-15))
       )) {
      local_28 = True;
    }
    else {
      local_28 = False;
    }
    if (ABS(bNorm) < 2.2250738585072014e-307) {
      LastAcc = 1.0;
    }
    else {
      LastAcc = rNorm / bNorm;
    }
    LastNoIter = Iter;
    if (RTCAuxProc != (RTCAuxProcType)0x0) {
      (*RTCAuxProc)(Iter,rNorm,bNorm,IterId);
    }
  }
  else {
    local_28 = True;
  }
  return local_28;
}

Assistant:

Boolean RTCResult(int Iter, double rNorm, double bNorm, IterIdType IterId)
/* get result of RTC */
{
    Boolean Result;

    if (LASResult() == LASOK) {
        if (rNorm < RTCEps * bNorm || (IsZero(bNorm) && IsOne(1.0 + rNorm)))
            Result = True;
        else
            Result = False;

        LastNoIter = Iter;
        if (!IsZero(bNorm))
            LastAcc = rNorm / bNorm;
        else
            LastAcc = 1.0;

        if (RTCAuxProc != NULL)
            (*RTCAuxProc)(Iter, rNorm, bNorm, IterId);
    } else {
        Result = True;
    }

    return(Result);
}